

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitMemoryGrow(FunctionValidator *this,MemoryGrow *curr)

{
  Type left;
  Memory *pMVar1;
  Type right;
  
  pMVar1 = Module::getMemoryOrNull
                     ((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .currModule,(Name)(curr->memory).super_IString.str);
  shouldBeTrue<wasm::MemoryGrow*>(this,pMVar1 != (Memory *)0x0,curr,"memory.grow memory must exist")
  ;
  left.id = (curr->delta->type).id;
  right = indexType(this,(Name)(curr->memory).super_IString.str);
  shouldBeEqualOrFirstIsUnreachable<wasm::MemoryGrow*,wasm::Type>
            (this,left,right,curr,"memory.grow must match memory index type");
  return;
}

Assistant:

void FunctionValidator::visitMemoryGrow(MemoryGrow* curr) {
  auto* memory = getModule()->getMemoryOrNull(curr->memory);
  shouldBeTrue(!!memory, curr, "memory.grow memory must exist");
  shouldBeEqualOrFirstIsUnreachable(curr->delta->type,
                                    indexType(curr->memory),
                                    curr,
                                    "memory.grow must match memory index type");
}